

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
vkt::ssbo::anon_unknown_15::computeBufferSizes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ShaderInterface *interface,
          BufferLayout *layout)

{
  int iVar1;
  pointer piVar2;
  char *__s;
  pointer pBVar3;
  int *piVar4;
  pointer pBVar5;
  BufferLayout *this;
  uint uVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  undefined8 *puVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  int *piVar17;
  string apiName;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  vector<int,_std::allocator<int>_> *local_230;
  long *local_228;
  undefined8 local_220;
  long local_218;
  undefined8 uStack_210;
  ShaderInterface *local_208;
  long local_200;
  BufferLayout *local_1f8;
  ulong local_1f0;
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  allocator_type local_1a8 [112];
  ios_base local_138 [264];
  
  local_230 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,local_1a8);
  pvVar7 = (vector<int,_std::allocator<int>_> *)
           (interface->m_bufferBlocks).
           super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(interface->m_bufferBlocks).
                          super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) >> 3) < 1) {
    return pvVar7;
  }
  local_200 = 0;
  local_208 = interface;
  local_1f8 = layout;
LAB_006bfc65:
  piVar2 = (&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start)[local_200];
  uVar6 = piVar2[0x16];
  local_1f0 = 1;
  if (1 < (int)uVar6) {
    local_1f0 = (ulong)uVar6;
  }
  uVar13 = 0;
LAB_006bfc89:
  __s = *(char **)piVar2;
  if ((int)uVar6 < 1) {
    puVar12 = &local_220;
    plVar8 = &local_218;
    local_228 = &local_218;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<((ostringstream *)local_1a8,(int)uVar13);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0xb58f90);
    local_250 = &local_240;
    plVar10 = plVar8 + 2;
    if ((long *)*plVar8 == plVar10) {
      local_240 = *plVar10;
      lStack_238 = plVar8[3];
    }
    else {
      local_240 = *plVar10;
      local_250 = (long *)*plVar8;
    }
    local_248 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_218 = *plVar8;
      uStack_210 = puVar9[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar8;
      local_228 = (long *)*puVar9;
    }
    puVar12 = puVar9 + 1;
    local_220 = puVar9[1];
    *puVar9 = plVar8;
  }
  *puVar12 = 0;
  *(undefined1 *)plVar8 = 0;
  strlen(__s);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)__s);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_1e8.field_2._M_allocated_capacity = *psVar11;
    local_1e8.field_2._8_8_ = plVar8[3];
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar11;
    local_1e8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1e8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  this = local_1f8;
  if (0 < (int)uVar6) {
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
  }
  uVar6 = BufferLayout::getBlockIndex(this,&local_1e8);
  if (-1 < (int)uVar6) {
    pBVar3 = (this->blocks).
             super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar15 = *(int **)&pBVar3[uVar6].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>
    ;
    piVar4 = *(pointer *)
              ((long)&pBVar3[uVar6].activeVarIndices.super__Vector_base<int,_std::allocator<int>_> +
              8);
    iVar14 = 0;
    if (piVar15 != piVar4) {
      pBVar5 = (this->bufferVars).
               super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar17 = piVar15;
      do {
        if ((pBVar5[*piVar17].arraySize == 0) || (pBVar5[*piVar17].topLevelArraySize == 0)) {
          iVar16 = *(int *)(*(long *)(piVar2 + 0x18) + uVar13 * 4);
          goto LAB_006bff1b;
        }
        piVar17 = piVar17 + 1;
      } while (piVar17 != piVar4);
    }
    iVar16 = 0;
    goto LAB_006bfec9;
  }
  goto LAB_006bfede;
  while (piVar15 = piVar15 + 1, piVar15 != piVar4) {
LAB_006bff1b:
    iVar1 = *piVar15;
    if (pBVar5[iVar1].arraySize == 0) {
      iVar14 = pBVar5[iVar1].arrayStride;
      break;
    }
    if (pBVar5[iVar1].topLevelArraySize == 0) {
      iVar14 = pBVar5[iVar1].topLevelArrayStride;
      break;
    }
  }
LAB_006bfec9:
  (local_230->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start[uVar6] = iVar16 * iVar14 + pBVar3[uVar6].size;
LAB_006bfede:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  uVar13 = uVar13 + 1;
  if (uVar13 == local_1f0) goto LAB_006bff4e;
  uVar6 = piVar2[0x16];
  goto LAB_006bfc89;
LAB_006bff4e:
  local_200 = local_200 + 1;
  pvVar7 = (vector<int,_std::allocator<int>_> *)
           (local_208->m_bufferBlocks).
           super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(local_208->m_bufferBlocks).
                          super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) >> 3) <=
      local_200) {
    return pvVar7;
  }
  goto LAB_006bfc65;
}

Assistant:

vector<int> computeBufferSizes (const ShaderInterface& interface, const BufferLayout& layout)
{
	vector<int> sizes(layout.blocks.size());

	for (int declNdx = 0; declNdx < interface.getNumBlocks(); declNdx++)
	{
		const BufferBlock&	block			= interface.getBlock(declNdx);
		const bool			isArray			= block.isArray();
		const int			numInstances	= isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			const string	apiName		= getBlockAPIName(block, instanceNdx);
			const int		blockNdx	= layout.getBlockIndex(apiName);

			if (blockNdx >= 0)
			{
				const BlockLayoutEntry&		blockLayout		= layout.blocks[blockNdx];
				const int					baseSize		= blockLayout.size;
				const bool					isLastUnsized	= hasUnsizedArray(layout, blockLayout);
				const int					lastArraySize	= isLastUnsized ? block.getLastUnsizedArraySize(instanceNdx) : 0;
				const int					stride			= isLastUnsized ? getUnsizedArrayStride(layout, blockLayout) : 0;

				sizes[blockNdx] = baseSize + lastArraySize*stride;
			}
		}
	}

	return sizes;
}